

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VAbs_Serial(N_Vector x,N_Vector z)

{
  int iVar1;
  long lVar2;
  long lVar3;
  realtype *zd;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  N_Vector x_local;
  
  iVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 8);
  lVar3 = *(long *)((long)z->content + 8);
  for (i = 0; i < iVar1; i = i + 1) {
    *(ulong *)(lVar3 + (long)i * 8) = *(ulong *)(lVar2 + (long)i * 8) & 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void N_VAbs_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++)
    zd[i] = SUNRabs(xd[i]);

  return;
}